

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdStoreWord(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  undefined4 local_20;
  undefined4 local_1c;
  x86Reg address;
  x86Reg temp;
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx_local._1_1_ = cmd.rA;
  local_1c = CodeGenGenericContext::FindRegAtMemory
                       (&ctx->ctx,sDWORD,rNONE,1,rEBX,(uint)ctx_local._1_1_ << 3,true);
  if (local_1c == rRegCount) {
    local_1c = CodeGenGenericContext::GetReg(&ctx->ctx);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,local_1c,sDWORD,rEBX,(uint)ctx_local._1_1_ << 3);
  }
  else {
    CodeGenGenericContext::LockReg(&ctx->ctx,local_1c);
  }
  ctx_local._3_1_ = cmd.rC;
  ctx_local._4_4_ = cmd.argument;
  if (ctx_local._3_1_ == 1) {
    EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sWORD,rR15,ctx_local._4_4_,local_1c);
  }
  else {
    local_20 = CodeGenGenericContext::FindRegAtMemory
                         (&ctx->ctx,sQWORD,rNONE,1,rEBX,(uint)ctx_local._3_1_ << 3,true);
    if (local_20 == rRegCount) {
      local_20 = CodeGenGenericContext::GetReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,local_20,sQWORD,rEBX,(uint)ctx_local._3_1_ << 3);
    }
    EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sWORD,local_20,ctx_local._4_4_,local_1c);
  }
  return;
}

Assistant:

void GenCodeCmdStoreWord(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	x86Reg temp = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rREG, cmd.rA * 8, true);

	if(temp == rRegCount)
	{
		temp = ctx.ctx.GetReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, temp, sDWORD, rREG, cmd.rA * 8); // Load value
	}
	else
	{
		ctx.ctx.LockReg(temp);
	}

	if(cmd.rC == rvrrFrame)
	{
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sWORD, rR15, cmd.argument, temp); // Store short value
	}
	else
	{
		x86Reg address = ctx.ctx.FindRegAtMemory(sQWORD, rNONE, 1, rREG, cmd.rC * 8, true);

		if(address == rRegCount)
		{
			address = ctx.ctx.GetReg();

			EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, address, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		}

		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sWORD, address, cmd.argument, temp); // Store value to target with an offset
	}
#else
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rA * 8); // Load value

	x86GenCodeStoreInt16ToPointer(ctx, rEAX, rEDX, cmd.rC, cmd.argument);
#endif
}